

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O2

void PyreNet::LayerThreadPool::threadJob(void)

{
  _Elt_pointer pLVar1;
  vector<double,_std::allocator<double>_> *input;
  Perceptron *this;
  Activation *activation;
  int *piVar2;
  LayerThreadPool *pLVar3;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lg;
  
  pLVar3 = getInstance();
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_48,&pLVar3->queueMutex)
  ;
  lg._8_8_ = &pLVar3->trackMutex;
  do {
    while (pLVar1 = (pLVar3->layerQueue).c.
                    super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (pLVar3->layerQueue).c.
          super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == pLVar1) {
      std::condition_variable::wait((unique_lock *)&pLVar3->newJobCv);
    }
    input = pLVar1->input;
    this = pLVar1->p;
    activation = pLVar1->activation;
    piVar2 = pLVar1->track;
    std::
    deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
    ::pop_front(&(pLVar3->layerQueue).c);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_48);
    Perceptron::calculate(this,input,activation);
    std::mutex::lock((mutex *)lg._8_8_);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    pthread_mutex_unlock((pthread_mutex_t *)lg._8_8_);
  } while( true );
}

Assistant:

[[noreturn]] void LayerThreadPool::threadJob() {
        LayerThreadPool* tpi = getInstance();
        std::unique_lock<std::mutex> lg(tpi->queueMutex);
        while (true) {
            if (!tpi->layerQueue.empty()) {
                LayerQueueJob job = tpi->layerQueue.front();
                tpi->layerQueue.pop();
                lg.unlock();
                job.p.calculate(job.input, job.activation);
                std::lock_guard<std::mutex> lgt(tpi->trackMutex);
                job.track--;
                if (job.track == 0) {
                    tpi->jobDoneCv.notify_all();
                }
                lg.lock();
            } else {
                tpi->newJobCv.wait(lg);
            }
        }
    }